

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affix.c
# Opt level: O0

err_t affixPrint(int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  char *in_RSI;
  int in_EDI;
  char *scope;
  err_t code;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  if ((in_EDI < 1) || (2 < in_EDI)) {
    eVar3 = 0x25b;
  }
  else {
    if (in_EDI == 2) {
      pcVar1 = *(char **)in_RSI;
      sVar2 = strLen((char *)0x102b5f);
      if ((sVar2 == 0) || (*pcVar1 != '-')) {
        return 0x25b;
      }
      in_EDI = in_EDI + -1;
      in_RSI = in_RSI + 8;
    }
    eVar3 = cmdFileValExist((int)in_RSI,
                            (char **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (eVar3 == 0) {
      eVar3 = cmdAffixPrint((char *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),in_RSI);
    }
  }
  return eVar3;
}

Assistant:

static err_t affixPrint(int argc, char* argv[])
{
	err_t code;
	const char* scope = 0;
	// обработать опции
	if (argc < 1 || argc > 2)
		return ERR_CMD_PARAMS;
	if (argc == 2)
	{
		scope = argv[0];
		if (strLen(scope) < 1 || scope[0] != '-')
			return ERR_CMD_PARAMS;
		++scope, --argc, ++argv;
	}
	// проверить наличие файла
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	// печатать
	return cmdAffixPrint(argv[0], scope);
}